

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseUnresolvedName(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    uVar1 = ((guard.state_)->parse_state).mangled_idx;
    uVar2 = ((guard.state_)->parse_state).out_cur_idx;
    uVar3 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
    bVar4 = ParseTwoCharToken(guard.state_,"gs");
    bVar4 = Optional(bVar4);
    if ((bVar4) && (bVar4 = ParseBaseUnresolvedName(guard.state_), bVar4)) {
      state_local._7_1_ = true;
    }
    else {
      ((guard.state_)->parse_state).mangled_idx = uVar1;
      ((guard.state_)->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
      bVar4 = ParseTwoCharToken(guard.state_,"sr");
      if (((bVar4) && (bVar4 = ParseUnresolvedType(guard.state_), bVar4)) &&
         (bVar4 = ParseBaseUnresolvedName(guard.state_), bVar4)) {
        state_local._7_1_ = true;
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        bVar4 = ParseTwoCharToken(guard.state_,"sr");
        if ((((bVar4) && (bVar4 = ParseOneCharToken(guard.state_,'N'), bVar4)) &&
            ((bVar4 = ParseUnresolvedType(guard.state_), bVar4 &&
             ((bVar4 = OneOrMore(ParseSimpleId,guard.state_), bVar4 &&
              (bVar4 = ParseOneCharToken(guard.state_,'E'), bVar4)))))) &&
           (bVar4 = ParseBaseUnresolvedName(guard.state_), bVar4)) {
          state_local._7_1_ = true;
        }
        else {
          ((guard.state_)->parse_state).mangled_idx = uVar1;
          ((guard.state_)->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
          bVar4 = ParseTwoCharToken(guard.state_,"gs");
          bVar4 = Optional(bVar4);
          if ((((bVar4) && (bVar4 = ParseTwoCharToken(guard.state_,"sr"), bVar4)) &&
              (bVar4 = OneOrMore(ParseSimpleId,guard.state_), bVar4)) &&
             ((bVar4 = ParseOneCharToken(guard.state_,'E'), bVar4 &&
              (bVar4 = ParseBaseUnresolvedName(guard.state_), bVar4)))) {
            state_local._7_1_ = true;
          }
          else {
            ((guard.state_)->parse_state).mangled_idx = uVar1;
            ((guard.state_)->parse_state).out_cur_idx = uVar2;
            *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
            state_local._7_1_ = false;
          }
        }
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseUnresolvedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseUnresolvedType(state) &&
      ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseOneCharToken(state, 'N') &&
      ParseUnresolvedType(state) &&
      OneOrMore(/* <unresolved-qualifier-level> ::= */ ParseSimpleId, state) &&
      ParseOneCharToken(state, 'E') && ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (Optional(ParseTwoCharToken(state, "gs")) &&
      ParseTwoCharToken(state, "sr") &&
      OneOrMore(/* <unresolved-qualifier-level> ::= */ ParseSimpleId, state) &&
      ParseOneCharToken(state, 'E') && ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}